

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

void __thiscall
kratos::Generator::wire_interface
          (Generator *this,shared_ptr<kratos::InterfaceRef> *inst1,
          shared_ptr<kratos::InterfaceRef> *inst2)

{
  key_type *__k;
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *this_00;
  Generator *this_01;
  Generator *this_02;
  InterfaceRef *this_03;
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  iterator iVar4;
  shared_ptr<kratos::InterfaceRef> *psVar5;
  const_iterator cVar6;
  Port *var;
  const_iterator cVar7;
  UserException *pUVar8;
  shared_ptr<kratos::InterfaceRef> *psVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_04;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  _Hash_node_base *p_Var10;
  shared_ptr<kratos::AssignStmt> sVar11;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  string local_f8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_d8;
  shared_ptr<kratos::InterfaceRef> *local_d0;
  shared_ptr<kratos::InterfaceRef> *local_c8;
  shared_ptr<kratos::Stmt> local_c0;
  shared_ptr<kratos::Stmt> local_b0;
  string local_a0;
  string local_80;
  Generator *local_60;
  element_type *local_58;
  pointer ppStack_50;
  pointer local_48;
  pointer ppStack_40;
  
  this_01 = ((inst1->super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            gen_;
  this_02 = ((inst2->super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            gen_;
  local_60 = this;
  std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<kratos::Generator,void>
            ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffa8,
             (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
             &this_02->super_enable_shared_from_this<kratos::Generator>);
  iVar4 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this_01->children_)._M_h,
                 (key_type *)&(local_58->scope_context_)._M_t._M_impl.super__Rb_tree_header);
  if (ppStack_50 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppStack_50);
  }
  psVar5 = inst2;
  psVar9 = inst1;
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<kratos::Generator,void>
              ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)
               &stack0xffffffffffffffa8,
               (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
               &this_01->super_enable_shared_from_this<kratos::Generator>);
    iVar4 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this_02->children_)._M_h,
                   (key_type *)&(local_58->scope_context_)._M_t._M_impl.super__Rb_tree_header);
    if (ppStack_50 != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppStack_50);
    }
    psVar5 = inst1;
    psVar9 = inst2;
    if (iVar4.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      pUVar8 = (UserException *)__cxa_allocate_exception(0x10);
      handle_name_abi_cxx11_(&local_80,this_02,false);
      handle_name_abi_cxx11_(&local_f8,this_01,false);
      local_58 = (element_type *)local_80._M_dataplus._M_p;
      ppStack_50 = (pointer)local_80._M_string_length;
      local_48 = (pointer)local_f8._M_dataplus._M_p;
      ppStack_40 = (pointer)local_f8._M_string_length;
      format_str_01.size_ = 0xdd;
      format_str_01.data_ = (char *)0x26;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&stack0xffffffffffffffa8;
      fmt::v7::detail::vformat_abi_cxx11_
                (&local_a0,(detail *)"{0} is not a child of {1} or vise visa",format_str_01,args_01)
      ;
      UserException::UserException(pUVar8,&local_a0);
      __cxa_throw(pUVar8,&UserException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  this_03 = (psVar9->super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_d0 = inst2;
  local_c8 = inst1;
  if (this_03->gen_ != local_60) {
    pUVar8 = (UserException *)__cxa_allocate_exception(0x10);
    handle_name_abi_cxx11_(&local_80,this_02,false);
    handle_name_abi_cxx11_(&local_f8,this_01,false);
    local_58 = (element_type *)local_80._M_dataplus._M_p;
    ppStack_50 = (pointer)local_80._M_string_length;
    local_48 = (pointer)local_f8._M_dataplus._M_p;
    ppStack_40 = (pointer)local_f8._M_string_length;
    format_str_00.size_ = 0xdd;
    format_str_00.data_ = (char *)0x26;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&stack0xffffffffffffffa8;
    fmt::v7::detail::vformat_abi_cxx11_
              (&local_a0,(detail *)"{0} is not a child of {1} or vise visa",format_str_00,args_00);
    UserException::UserException(pUVar8,&local_a0);
    __cxa_throw(pUVar8,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  p_Var10 = (((psVar5->super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
            ->ports_)._M_h._M_before_begin._M_nxt;
  if (p_Var10 != (_Hash_node_base *)0x0) {
    local_d8 = &(this_03->ports_)._M_h;
    this_00 = &local_60->stmts_;
    do {
      __k = (key_type *)(p_Var10 + 1);
      cVar6 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this_03->vars_)._M_h,__k);
      if (cVar6.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>,_true>
          ._M_cur == (__node_type *)0x0) {
        cVar7 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(local_d8,__k);
        if (cVar7.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Port_*>,_true>
            ._M_cur == (__node_type *)0x0) {
          pUVar8 = (UserException *)__cxa_allocate_exception(0x10);
          peVar1 = (local_c8->super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          peVar2 = (local_d0->super___shared_ptr<kratos::InterfaceRef,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          local_58 = (element_type *)(peVar1->name_)._M_dataplus._M_p;
          ppStack_50 = (pointer)(peVar1->name_)._M_string_length;
          local_48 = (pointer)(peVar2->name_)._M_dataplus._M_p;
          ppStack_40 = (pointer)(peVar2->name_)._M_string_length;
          format_str.size_ = 0xdd;
          format_str.data_ = (char *)0x25;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)&stack0xffffffffffffffa8;
          fmt::v7::detail::vformat_abi_cxx11_
                    (&local_a0,(detail *)"Unable to wire interface {0} with {1}",format_str,args);
          UserException::UserException(pUVar8,&local_a0);
          __cxa_throw(pUVar8,&UserException::typeinfo,std::runtime_error::~runtime_error);
        }
        var = InterfaceRef::port(this_03,__k);
      }
      else {
        var = (Port *)InterfaceRef::var(this_03,__k);
      }
      if (*(int *)&((Var *)p_Var10[5]._M_nxt)[1].super_IRNode._vptr_IRNode == 0) {
        sVar11 = Var::assign((Var *)&stack0xffffffffffffffa8,(Var *)p_Var10[5]._M_nxt);
        peVar3 = local_58;
        local_c0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
        local_c0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppStack_50;
        local_58 = (element_type *)0x0;
        ppStack_50 = (pointer)0x0;
        (*(peVar3->super_IRNode)._vptr_IRNode[7])
                  (peVar3,local_60,
                   sVar11.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi._M_pi);
        std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>::
        emplace_back<std::shared_ptr<kratos::Stmt>>
                  ((vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                    *)this_00,&local_c0);
        this_04._M_pi =
             local_c0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
      }
      else {
        sVar11 = Var::assign((Var *)&stack0xffffffffffffffa8,&var->super_Var);
        peVar3 = local_58;
        local_b0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
        local_b0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppStack_50;
        local_58 = (element_type *)0x0;
        ppStack_50 = (pointer)0x0;
        (*(peVar3->super_IRNode)._vptr_IRNode[7])
                  (peVar3,local_60,
                   sVar11.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi._M_pi);
        std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>::
        emplace_back<std::shared_ptr<kratos::Stmt>>
                  ((vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                    *)this_00,&local_b0);
        this_04._M_pi =
             local_b0.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
      }
      if ((pointer)this_04._M_pi != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_04._M_pi);
      }
      if (ppStack_50 != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppStack_50);
      }
      p_Var10 = p_Var10->_M_nxt;
    } while (p_Var10 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void Generator::wire_interface(const std::shared_ptr<InterfaceRef> &inst1,
                               const std::shared_ptr<InterfaceRef> &inst2) {
    // the orientation is determined by the generator reference from the interface instance
    auto *gen1 = inst1->gen();
    auto *gen2 = inst2->gen();
    InterfaceRef *parent = nullptr;
    InterfaceRef *child = nullptr;
    if (gen1->has_child_generator(gen2->shared_from_this())) {
        // gen2 is gen1's child
        // wiring gen2's ports to gen1's
        parent = inst1.get();
        child = inst2.get();
    } else if (gen2->has_child_generator(gen1->shared_from_this())) {
        parent = inst2.get();
        child = inst1.get();
    } else {
        throw UserException(::format("{0} is not a child of {1} or vise visa", gen2->handle_name(),
                                     gen1->handle_name()));
    }
    if (parent->gen() != this) {
        throw UserException(::format("{0} is not a child of {1} or vise visa", gen2->handle_name(),
                                     gen1->handle_name()));
    }

    auto const &ports = child->ports();
    for (auto const &[port_name, port] : ports) {
        Var *v = nullptr;
        if (parent->has_var(port_name)) {
            v = &parent->var(port_name);
        } else if (parent->has_port(port_name)) {
            v = &parent->port(port_name);
        }
        if (!v) {
            throw UserException(
                (::format("Unable to wire interface {0} with {1}", inst1->name(), inst2->name())));
        }
        if (port->port_direction() == PortDirection::In) {
            add_stmt(port->assign(*v));
        } else {
            add_stmt(v->assign(*port));
        }
    }
}